

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boundary_element.cpp
# Opt level: O2

void __thiscall BoundaryElement::downward_pass(BoundaryElement *this,double *potential)

{
  double *pdVar1;
  long lVar2;
  uint uVar3;
  Timers_BoundaryElement *pTVar4;
  Elements *pEVar5;
  InterpolationPoints *pIVar6;
  undefined1 auVar7 [16];
  int iVar8;
  rep rVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  pointer pdVar14;
  ulong uVar15;
  ulong uVar16;
  pointer pdVar17;
  ulong node_idx;
  long lVar18;
  ulong uVar19;
  pointer pdVar20;
  pointer pdVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  undefined1 auVar27 [16];
  double dVar28;
  double dVar29;
  array<unsigned_long,_2UL> aVar30;
  allocator_type local_159;
  BoundaryElement *local_158;
  pointer local_150;
  int local_144;
  pointer local_140;
  pointer local_138;
  pointer local_130;
  pointer local_128;
  long local_120;
  long local_118;
  ulong local_110;
  size_t local_108;
  pointer local_100;
  pointer local_f8;
  pointer local_f0;
  pointer local_e8;
  pointer local_e0;
  pointer local_d8;
  pointer local_d0;
  double *local_c8;
  long local_c0;
  unsigned_long local_b8;
  long local_b0;
  long local_a8;
  ulong local_a0;
  pointer local_98;
  pointer local_90;
  pointer local_88;
  pointer local_80;
  long local_78;
  ulong local_70;
  ulong local_68;
  pointer local_60;
  pointer local_58;
  ulong local_50;
  vector<double,_std::allocator<double>_> weights;
  
  pTVar4 = this->timers_;
  local_c8 = potential;
  rVar9 = std::chrono::_V2::steady_clock::now();
  (pTVar4->downward_pass).start_time_.__d.__r = rVar9;
  pEVar5 = this->elements_;
  pIVar6 = this->interp_pts_;
  local_138 = (pIVar6->interp_x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
  local_140 = (pIVar6->interp_y_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
  local_150 = (pIVar6->interp_z_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
  local_80 = (this->interp_potential_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_88 = (this->interp_potential_dx_).super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start;
  local_90 = (this->interp_potential_dy_).super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start;
  local_98 = (this->interp_potential_dz_).super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start;
  local_d0 = (pEVar5->super_Particles).x_.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start;
  local_d8 = (pEVar5->super_Particles).y_.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start;
  local_e0 = (pEVar5->super_Particles).z_.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start;
  local_e8 = (pEVar5->target_charge_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_f0 = (pEVar5->target_charge_dx_).super__Vector_base<double,_std::allocator<double>_>._M_impl
             .super__Vector_impl_data._M_start;
  local_f8 = (pEVar5->target_charge_dy_).super__Vector_base<double,_std::allocator<double>_>._M_impl
             .super__Vector_impl_data._M_start;
  local_100 = (pEVar5->target_charge_dz_).super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start;
  local_158 = this;
  std::vector<double,_std::allocator<double>_>::vector
            (&weights,(long)pIVar6->num_interp_pts_per_node_,&local_159);
  uVar10 = (ulong)((long)weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start) >> 3;
  iVar8 = (int)uVar10;
  uVar15 = 0;
  uVar10 = uVar10 & 0xffffffff;
  if (iVar8 < 1) {
    uVar10 = uVar15;
  }
  for (; uVar10 != uVar15; uVar15 = uVar15 + 1) {
    dVar22 = *(double *)(&DAT_00115860 + (ulong)((uVar15 & 1) == 0) * 8) * 0.5;
    dVar24 = dVar22;
    if (iVar8 - 1 != uVar15) {
      dVar24 = *(double *)(&DAT_00115860 + (ulong)((uVar15 & 1) == 0) * 8);
    }
    if (uVar15 != 0) {
      dVar22 = dVar24;
    }
    weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[uVar15] = dVar22;
  }
  local_108 = (local_158->elements_->super_Particles).num_;
  uVar3 = local_158->interp_pts_->num_interp_pts_per_node_;
  local_68 = (ulong)uVar3;
  local_118 = (long)(int)uVar3;
  local_144 = uVar3 * uVar3;
  uVar10 = 0;
  if (0 < (int)uVar3) {
    uVar10 = (ulong)uVar3;
  }
  local_120 = local_118 * 8;
  lVar2 = local_68 * 8;
  local_128 = local_138;
  local_130 = local_140;
  uVar15 = 0;
  local_a0 = uVar10;
  while (node_idx = uVar15, node_idx < local_158->tree_->num_nodes_) {
    aVar30 = Tree::node_particle_idxs(local_158->tree_,node_idx);
    local_b8 = aVar30._M_elems[0];
    local_78 = (long)local_158->num_charges_per_node_ * node_idx;
    local_c0 = aVar30._M_elems[1] - local_b8;
    local_58 = local_140 + node_idx * local_118;
    local_60 = local_138 + node_idx * local_118;
    lVar18 = 0;
    while (lVar13 = lVar18, lVar13 != local_c0) {
      local_b0 = lVar13 + local_b8;
      dVar22 = 0.0;
      dVar24 = 0.0;
      dVar25 = 0.0;
      uVar15 = 0xffffffffffffffff;
      uVar19 = 0xffffffff;
      local_50 = 0xffffffff;
      for (uVar11 = 0; uVar10 != uVar11; uVar11 = uVar11 + 1) {
        dVar26 = local_d0[local_b0] - local_128[uVar11];
        dVar23 = weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar11];
        dVar25 = dVar25 + dVar23 / dVar26;
        dVar28 = local_e0[local_b0] - local_150[uVar11];
        dVar29 = local_d8[local_b0] - local_130[uVar11];
        auVar27._8_8_ = dVar23;
        auVar27._0_8_ = dVar23;
        if (ABS(dVar26) < 2.2250738585072014e-308) {
          uVar15 = uVar11;
        }
        uVar15 = uVar15 & 0xffffffff;
        auVar7._8_8_ = dVar29;
        auVar7._0_8_ = dVar28;
        auVar27 = divpd(auVar27,auVar7);
        if (ABS(dVar29) < 2.2250738585072014e-308) {
          local_50 = uVar11 & 0xffffffff;
        }
        dVar22 = dVar22 + auVar27._0_8_;
        dVar24 = dVar24 + auVar27._8_8_;
        if (ABS(dVar28) < 2.2250738585072014e-308) {
          uVar19 = uVar11 & 0xffffffff;
        }
      }
      dVar23 = 1.0;
      if ((int)uVar15 == -1) {
        dVar23 = 1.0 / dVar25;
      }
      if ((int)local_50 == -1) {
        dVar23 = dVar23 / dVar24;
      }
      if ((int)uVar19 == -1) {
        dVar23 = dVar23 / dVar22;
      }
      dVar22 = 0.0;
      dVar24 = 0.0;
      dVar25 = 0.0;
      dVar26 = 0.0;
      uVar11 = 0;
      for (uVar16 = 0; uVar12 = uVar11, uVar16 != uVar10; uVar16 = uVar16 + 1) {
        iVar8 = (int)uVar12;
        lVar18 = iVar8 + local_78;
        pdVar14 = local_80 + lVar18;
        pdVar20 = local_88 + lVar18;
        pdVar21 = local_90 + lVar18;
        pdVar17 = local_98 + lVar18;
        for (uVar10 = 0; uVar10 != local_68; uVar10 = uVar10 + 1) {
          for (lVar18 = 0; lVar2 != lVar18; lVar18 = lVar18 + 8) {
            if ((int)uVar15 == -1) {
              dVar28 = weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar16] /
                       (local_d0[local_b0] - local_60[uVar16]);
            }
            else {
              dVar28 = 1.0;
              if (uVar16 != (uVar15 & 0xffffffff)) {
                dVar28 = 0.0;
              }
            }
            if ((int)local_50 == -1) {
              dVar28 = dVar28 * (weights.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                 .super__Vector_impl_data._M_start[uVar10] /
                                (local_d8[local_b0] - local_58[uVar10]));
            }
            else if (uVar10 != local_50) {
              dVar28 = dVar28 * 0.0;
            }
            if ((int)uVar19 == -1) {
              dVar28 = dVar28 * (*(double *)
                                  ((long)weights.super__Vector_base<double,_std::allocator<double>_>
                                         ._M_impl.super__Vector_impl_data._M_start + lVar18) /
                                (local_e0[local_b0] - *(double *)((long)local_150 + lVar18)));
            }
            else if (uVar19 << 3 != lVar18) {
              dVar28 = dVar28 * 0.0;
            }
            dVar28 = dVar28 * dVar23;
            dVar25 = dVar25 + *(double *)((long)pdVar21 + lVar18) * dVar28;
            dVar26 = dVar26 + *(double *)((long)pdVar17 + lVar18) * dVar28;
            dVar22 = dVar22 + *(double *)((long)pdVar14 + lVar18) * dVar28;
            dVar24 = dVar24 + *(double *)((long)pdVar20 + lVar18) * dVar28;
          }
          pdVar14 = (pointer)((long)pdVar14 + local_120);
          pdVar20 = (pointer)((long)pdVar20 + local_120);
          pdVar21 = (pointer)((long)pdVar21 + local_120);
          pdVar17 = (pointer)((long)pdVar17 + local_120);
        }
        uVar11 = (ulong)(uint)(iVar8 + local_144);
        uVar10 = local_a0;
        local_70 = uVar12;
      }
      dVar23 = local_f8[local_b0];
      dVar28 = local_f0[local_b0];
      dVar29 = local_100[local_b0];
      pdVar1 = local_c8 + local_b0;
      *pdVar1 = local_e8[local_b0] * dVar22 + *pdVar1;
      pdVar1[local_108] = dVar26 * dVar29 + dVar24 * dVar28 + dVar23 * dVar25 + pdVar1[local_108];
      local_a8 = lVar13;
      lVar18 = lVar13 + 1;
    }
    local_150 = (pointer)((long)local_150 + local_120);
    local_130 = (pointer)((long)local_130 + local_120);
    local_128 = (pointer)((long)local_128 + local_120);
    local_110 = node_idx;
    uVar15 = node_idx + 1;
  }
  Timer::stop(&local_158->timers_->downward_pass);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&weights.super__Vector_base<double,_std::allocator<double>_>);
  return;
}

Assistant:

void BoundaryElement::downward_pass(double* __restrict potential)
{
    timers_.downward_pass.start();

    const double* __restrict clusters_x_ptr    = interp_pts_.interp_x_ptr();
    const double* __restrict clusters_y_ptr    = interp_pts_.interp_y_ptr();
    const double* __restrict clusters_z_ptr    = interp_pts_.interp_z_ptr();
    
    const double* __restrict clusters_p_ptr    = interp_potential_.data();
    const double* __restrict clusters_p_dx_ptr = interp_potential_dx_.data();
    const double* __restrict clusters_p_dy_ptr = interp_potential_dy_.data();
    const double* __restrict clusters_p_dz_ptr = interp_potential_dz_.data();
    
    const double* __restrict elements_x_ptr   = elements_.x_ptr();
    const double* __restrict elements_y_ptr   = elements_.y_ptr();
    const double* __restrict elements_z_ptr   = elements_.z_ptr();
    
    const double* __restrict targets_q_ptr     = elements_.target_charge_ptr();
    const double* __restrict targets_q_dx_ptr  = elements_.target_charge_dx_ptr();
    const double* __restrict targets_q_dy_ptr  = elements_.target_charge_dy_ptr();
    const double* __restrict targets_q_dz_ptr  = elements_.target_charge_dz_ptr();
    
    std::vector<double> weights (interp_pts_.num_interp_pts_per_node());
    double* weights_ptr = weights.data();
    int weights_num = weights.size();
    
    for (int i = 0; i < weights_num; ++i) {
        weights[i] = ((i % 2 == 0)? 1 : -1);
        if (i == 0 || i == weights_num-1) weights[i] = ((i % 2 == 0)? 1 : -1) * 0.5;
    }
    
    std::size_t potential_offset = elements_.num();
    int num_interp_pts_per_node = interp_pts_.num_interp_pts_per_node();
    
#ifdef OPENACC_ENABLED
#pragma acc enter data copyin(weights_ptr[0:weights_num])
#endif
    
    for (std::size_t node_idx = 0; node_idx < tree_.num_nodes(); ++node_idx) {
        
        auto particle_idxs = tree_.node_particle_idxs(node_idx);
        std::size_t node_interp_pts_start = node_idx * num_interp_pts_per_node;
        std::size_t node_potentials_start = node_idx * num_charges_per_node_;
        
        std::size_t particle_start = particle_idxs[0];
        std::size_t num_particles  = particle_idxs[1] - particle_idxs[0];

#ifdef OPENACC_ENABLED
        int stream_id = std::rand() % 3;
#pragma acc parallel loop async(stream_id) present(elements_x_ptr, elements_y_ptr, elements_z_ptr, \
                                  targets_q_ptr, targets_q_dx_ptr, targets_q_dy_ptr, targets_q_dz_ptr, \
                                  clusters_x_ptr, clusters_y_ptr, clusters_z_ptr, \
                                  clusters_p_ptr, clusters_p_dx_ptr, clusters_p_dy_ptr, clusters_p_dz_ptr, \
                                  potential, weights_ptr)
#endif
        for (std::size_t i = 0; i < num_particles; ++i) {
        
            double denominator_x = 0.;
            double denominator_y = 0.;
            double denominator_z = 0.;
            
            int exact_idx_x = -1;
            int exact_idx_y = -1;
            int exact_idx_z = -1;
            
            double xx = elements_x_ptr[particle_start + i];
            double yy = elements_y_ptr[particle_start + i];
            double zz = elements_z_ptr[particle_start + i];
            
#ifdef OPENACC_ENABLED
            #pragma acc loop reduction(+:denominator_x,denominator_y,denominator_z) \
                             reduction(max:exact_idx_x,exact_idx_y,exact_idx_z)
#endif
            for (int j = 0; j < num_interp_pts_per_node; ++j) {
            
                double dist_x = xx - clusters_x_ptr[node_interp_pts_start + j];
                double dist_y = yy - clusters_y_ptr[node_interp_pts_start + j];
                double dist_z = zz - clusters_z_ptr[node_interp_pts_start + j];
                
                denominator_x += weights_ptr[j] / dist_x;
                denominator_y += weights_ptr[j] / dist_y;
                denominator_z += weights_ptr[j] / dist_z;
                
                if (std::abs(dist_x) < std::numeric_limits<double>::min()) exact_idx_x = j;
                if (std::abs(dist_y) < std::numeric_limits<double>::min()) exact_idx_y = j;
                if (std::abs(dist_z) < std::numeric_limits<double>::min()) exact_idx_z = j;
            }
            
            double denominator = 1.;
            if (exact_idx_x == -1) denominator /= denominator_x;
            if (exact_idx_y == -1) denominator /= denominator_y;
            if (exact_idx_z == -1) denominator /= denominator_z;

            double pot_comp_   = 0.;
            double pot_comp_dx = 0.;
            double pot_comp_dy = 0.;
            double pot_comp_dz = 0.;
            
#ifdef OPENACC_ENABLED
            #pragma acc loop collapse(3) reduction(+:pot_comp_,  pot_comp_dx, \
                                                     pot_comp_dy,pot_comp_dz)
#endif
            for (int k1 = 0; k1 < num_interp_pts_per_node; ++k1) {
            for (int k2 = 0; k2 < num_interp_pts_per_node; ++k2) {
            for (int k3 = 0; k3 < num_interp_pts_per_node; ++k3) {
                    
                std::size_t kk = node_potentials_start
                               + k1 * num_interp_pts_per_node * num_interp_pts_per_node
                               + k2 * num_interp_pts_per_node + k3;
                               
                double dist_x = xx - clusters_x_ptr[node_interp_pts_start + k1];
                double dist_y = yy - clusters_y_ptr[node_interp_pts_start + k2];
                double dist_z = zz - clusters_z_ptr[node_interp_pts_start + k3];
                
                double numerator = 1.;

                // If exact_idx == -1, then no issues.
                // If exact_idx != -1, then we want to zero out terms EXCEPT when exactInd=k1.
                if (exact_idx_x == -1) {
                    numerator *= weights_ptr[k1] / dist_x;
                } else {
                    if (exact_idx_x != k1) numerator *= 0.;
                }

                if (exact_idx_y == -1) {
                    numerator *= weights_ptr[k2] / dist_y;
                } else {
                    if (exact_idx_y != k2) numerator *= 0.;
                }

                if (exact_idx_z == -1) {
                    numerator *= weights_ptr[k3] / dist_z;
                } else {
                    if (exact_idx_z != k3) numerator *= 0.;
                }

                pot_comp_   += numerator * denominator * clusters_p_ptr   [kk];
                pot_comp_dx += numerator * denominator * clusters_p_dx_ptr[kk];
                pot_comp_dy += numerator * denominator * clusters_p_dy_ptr[kk];
                pot_comp_dz += numerator * denominator * clusters_p_dz_ptr[kk];
            }
            }
            }
            
            double pot_temp_1 = targets_q_ptr   [particle_start + i] * pot_comp_;
            double pot_temp_2 = targets_q_dx_ptr[particle_start + i] * pot_comp_dx
                              + targets_q_dy_ptr[particle_start + i] * pot_comp_dy
                              + targets_q_dz_ptr[particle_start + i] * pot_comp_dz;
#ifdef OPENACC_ENABLED
            #pragma acc atomic update
#endif
            potential[particle_start + i]                    += pot_temp_1;
#ifdef OPENACC_ENABLED
            #pragma acc atomic update
#endif
            potential[particle_start + i + potential_offset] += pot_temp_2;
        }
    } //end loop over nodes
#ifdef OPENACC_ENABLED
    #pragma acc wait
    #pragma acc exit data delete(weights_ptr[0:weights_num])
#endif

    timers_.downward_pass.stop();
}